

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

uint32_t Function_Pool::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  FunctionTask local_170;
  
  FunctionTask::FunctionTask(&local_170);
  uVar1 = FunctionTask::Sum(&local_170,image,x,y,width,height);
  FunctionTask::~FunctionTask(&local_170);
  return uVar1;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        return FunctionTask().Sum( image, x, y, width, height );
    }